

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O0

string * __thiscall ASTree::yield_abi_cxx11_(string *__return_storage_ptr__,ASTree *this)

{
  bool bVar1;
  size_type sVar2;
  reference ppAVar3;
  string local_60;
  ASTree *local_40;
  ASTree *subtree;
  iterator __end1;
  iterator __begin1;
  vector<ASTree_*,_std::allocator<ASTree_*>_> *__range1;
  ASTree *this_local;
  string *yield;
  
  sVar2 = std::vector<ASTree_*,_std::allocator<ASTree_*>_>::size(&this->subtrees);
  if (sVar2 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->root);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    __end1 = std::vector<ASTree_*,_std::allocator<ASTree_*>_>::begin(&this->subtrees);
    subtree = (ASTree *)std::vector<ASTree_*,_std::allocator<ASTree_*>_>::end(&this->subtrees);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<ASTree_**,_std::vector<ASTree_*,_std::allocator<ASTree_*>_>_>
                                       *)&subtree), bVar1) {
      ppAVar3 = __gnu_cxx::
                __normal_iterator<ASTree_**,_std::vector<ASTree_*,_std::allocator<ASTree_*>_>_>::
                operator*(&__end1);
      local_40 = *ppAVar3;
      yield_abi_cxx11_(&local_60,local_40);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      __gnu_cxx::__normal_iterator<ASTree_**,_std::vector<ASTree_*,_std::allocator<ASTree_*>_>_>::
      operator++(&__end1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ASTree::yield() {
    if(subtrees.size() == 0){
        // terminal
        return root;
    }
    std::string yield;
    for(auto subtree: subtrees){
        yield += subtree->yield();
    }
    return yield;
}